

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::split_node
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint index)

{
  uint *puVar1;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar8;
  void *p;
  char cVar9;
  uint i;
  long lVar10;
  vq_node *pvVar11;
  int iVar12;
  int iVar13;
  uint i_12;
  uint node_index;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint min_new_capacity;
  ulong uVar17;
  vq_node *pvVar18;
  float dist2;
  float fVar19;
  float fVar20;
  float dist2_1;
  float fVar21;
  float fVar22;
  float fVar23;
  vec<16U,_float> new_right_child;
  vec<16U,_float> new_left_child;
  vec<16U,_float> right_child;
  vec<16U,_float> left_child;
  vec<16U,_float> result;
  float local_1d0;
  float local_1cc;
  float local_1b4;
  float local_178 [16];
  undefined8 local_138;
  float afStack_130 [2];
  uint *local_128;
  undefined8 uStack_120;
  float local_118 [8];
  undefined1 local_f8 [64];
  undefined1 local_b8 [32];
  float local_98 [2];
  float afStack_90 [2];
  float local_88 [2];
  float afStack_80 [4];
  float afStack_70 [16];
  
  pvVar18 = (this->m_nodes).m_p;
  if (pvVar18[index].m_vectors.m_size != 1) {
    pvVar18 = pvVar18 + index;
    if (this->m_quick == true) {
      compute_split_estimate(this,(vec<16U,_float> *)local_b8,(vec<16U,_float> *)local_f8,pvVar18);
    }
    else {
      compute_split_pca(this,(vec<16U,_float> *)local_b8,(vec<16U,_float> *)local_f8,pvVar18);
    }
    iVar12 = 8;
    if (this->m_quick != false) {
      iVar12 = 2;
    }
    iVar13 = 0;
    local_1cc = 0.0;
    local_1b4 = 1e+10;
    local_1d0 = 0.0;
    do {
      if ((this->m_left_children).m_size != 0) {
        (this->m_left_children).m_size = 0;
      }
      if ((this->m_right_children).m_size != 0) {
        (this->m_right_children).m_size = 0;
      }
      local_118[4] = 0.0;
      local_118[5] = 0.0;
      local_118[6] = 0.0;
      local_118[7] = 0.0;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      local_118[3] = 0.0;
      local_128 = (uint *)0x0;
      uStack_120._0_4_ = 0;
      uStack_120._4_4_ = 0;
      local_138 = 0;
      afStack_130[0] = 0.0;
      afStack_130[1] = 0.0;
      local_178[0xc] = 0.0;
      local_178[0xd] = 0.0;
      local_178[0xe] = 0.0;
      local_178[0xf] = 0.0;
      local_178[8] = 0.0;
      local_178[9] = 0.0;
      local_178[10] = 0.0;
      local_178[0xb] = 0.0;
      local_178[4] = 0.0;
      local_178[5] = 0.0;
      local_178[6] = 0.0;
      local_178[7] = 0.0;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      local_178[3] = 0.0;
      if ((pvVar18->m_vectors).m_size == 0) {
        fVar20 = 0.0;
        fVar22 = 0.0;
        uVar14 = 0;
        uVar15 = 0;
      }
      else {
        fVar22 = 0.0;
        uVar17 = 0;
        uVar15 = 0;
        uVar14 = 0;
        fVar20 = 0.0;
        do {
          puVar7 = (pvVar18->m_vectors).m_p;
          ppVar8 = (this->m_training_vecs).m_p;
          ppVar2 = ppVar8 + puVar7[uVar17];
          uVar16 = (ulong)ppVar8[puVar7[uVar17]].second;
          fVar19 = 0.0;
          lVar10 = 0;
          do {
            fVar21 = *(float *)(local_b8 + lVar10 * 4) - (ppVar2->first).m_s[lVar10];
            fVar19 = fVar19 + fVar21 * fVar21;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x10);
          fVar21 = 0.0;
          lVar10 = 0;
          do {
            fVar23 = *(float *)(local_f8 + lVar10 * 4) - (ppVar2->first).m_s[lVar10];
            fVar21 = fVar21 + fVar23 * fVar23;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x10);
          if (fVar21 <= fVar19) {
            uVar4 = (this->m_right_children).m_size;
            if ((this->m_right_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_right_children,uVar4 + 1,true,4,
                         (object_mover)0x0,false);
            }
            (this->m_right_children).m_p[(this->m_right_children).m_size] = puVar7[uVar17];
            puVar1 = &(this->m_right_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar10 = 0;
            do {
              afStack_70[lVar10] = (ppVar2->first).m_s[lVar10] * (float)uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            lVar10 = 0;
            do {
              local_178[lVar10] = afStack_70[lVar10] + local_178[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            fVar19 = (ppVar2->first).m_s[0];
            fVar19 = fVar19 * fVar19;
            lVar10 = 1;
            do {
              fVar21 = (ppVar2->first).m_s[lVar10];
              fVar19 = fVar19 + fVar21 * fVar21;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            uVar14 = uVar14 + uVar16;
            fVar20 = fVar20 + fVar19 * (float)uVar16;
          }
          else {
            uVar4 = (this->m_left_children).m_size;
            if ((this->m_left_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_left_children,uVar4 + 1,true,4,
                         (object_mover)0x0,false);
            }
            (this->m_left_children).m_p[(this->m_left_children).m_size] = puVar7[uVar17];
            puVar1 = &(this->m_left_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar10 = 0;
            do {
              afStack_70[lVar10] = (ppVar2->first).m_s[lVar10] * (float)uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            lVar10 = 0;
            do {
              local_178[lVar10 + 0x10] = afStack_70[lVar10] + local_178[lVar10 + 0x10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            fVar19 = (ppVar2->first).m_s[0];
            fVar19 = fVar19 * fVar19;
            lVar10 = 1;
            do {
              fVar21 = (ppVar2->first).m_s[lVar10];
              fVar19 = fVar19 + fVar21 * fVar21;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            uVar15 = uVar15 + uVar16;
            fVar22 = fVar22 + fVar19 * (float)uVar16;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (pvVar18->m_vectors).m_size);
      }
      if (uVar15 == 0 || uVar14 == 0) {
        pvVar18->m_unsplittable = true;
        cVar9 = '\x01';
      }
      else {
        fVar19 = (float)local_138 * (float)local_138;
        lVar10 = 1;
        do {
          fVar19 = fVar19 + local_178[lVar10 + 0x10] * local_178[lVar10 + 0x10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        local_1cc = fVar22 - fVar19 / (float)uVar15;
        fVar22 = local_178[0] * local_178[0];
        lVar10 = 1;
        do {
          fVar22 = fVar22 + local_178[lVar10] * local_178[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        local_1d0 = fVar20 - fVar22 / (float)uVar14;
        lVar10 = 0;
        do {
          local_178[lVar10 + 0x10] = local_178[lVar10 + 0x10] * (1.0 / (float)uVar15);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        lVar10 = 0;
        do {
          local_178[lVar10] = local_178[lVar10] * (1.0 / (float)uVar14);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        local_88[0] = local_118[4];
        local_88[1] = local_118[5];
        afStack_80[0] = local_118[6];
        afStack_80[1] = local_118[7];
        local_98[0] = local_118[0];
        local_98[1] = local_118[1];
        afStack_90[0] = local_118[2];
        afStack_90[1] = local_118[3];
        local_b8._16_8_ = local_128;
        local_b8._24_4_ = (uint)uStack_120;
        local_b8._28_4_ = uStack_120._4_4_;
        local_b8._0_8_ = local_138;
        local_b8._8_4_ = afStack_130[0];
        local_b8._12_4_ = afStack_130[1];
        local_f8._0_4_ = local_178[0];
        local_f8._4_4_ = local_178[1];
        local_f8._8_4_ = local_178[2];
        local_f8._12_4_ = local_178[3];
        local_f8._16_4_ = local_178[4];
        local_f8._20_4_ = local_178[5];
        local_f8._24_4_ = local_178[6];
        local_f8._28_4_ = local_178[7];
        local_f8._32_4_ = local_178[8];
        local_f8._36_4_ = local_178[9];
        local_f8._40_4_ = local_178[10];
        local_f8._44_4_ = local_178[0xb];
        local_f8._48_4_ = local_178[0xc];
        local_f8._52_4_ = local_178[0xd];
        local_f8._56_4_ = local_178[0xe];
        local_f8._60_4_ = local_178[0xf];
        fVar20 = local_1cc + local_1d0;
        cVar9 = '\x02';
        if (1e-05 <= fVar20) {
          fVar22 = (local_1b4 - fVar20) / fVar20;
          if (0.00125 <= fVar22) {
            local_1b4 = fVar20;
          }
          cVar9 = (fVar22 < 0.00125) * '\x02';
        }
      }
      if (cVar9 != '\0') goto LAB_0013e88e;
      iVar13 = iVar13 + 1;
    } while (iVar13 != iVar12);
    cVar9 = '\x02';
LAB_0013e88e:
    if (cVar9 == '\x02') {
      uVar4 = (this->m_nodes).m_size;
      node_index = uVar4 + 1;
      pvVar18->m_left = uVar4;
      pvVar18->m_right = node_index;
      uVar5 = this->m_split_index;
      min_new_capacity = uVar4 + 2;
      pvVar18->m_codebook_index = uVar5;
      this->m_split_index = uVar5 + 1;
      if (uVar4 >> 1 < 0x7fffffff) {
        if ((this->m_nodes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_nodes,min_new_capacity,false,0x70,
                     vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover,
                     false);
        }
        uVar6 = (this->m_nodes).m_size;
        if (min_new_capacity - uVar6 != 0) {
          pvVar18 = (this->m_nodes).m_p;
          lVar10 = 0;
          do {
            puVar3 = (undefined8 *)((long)(&pvVar18[uVar6].m_centroid + 1) + lVar10 + 0x10);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar18[uVar6].m_centroid.m_s + lVar10);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar18[uVar6].m_centroid.m_s + lVar10 + 0x10);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar18[uVar6].m_centroid.m_s + lVar10 + 0x20);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar18[uVar6].m_centroid.m_s + lVar10 + 0x30);
            *puVar3 = 0;
            puVar3[1] = 0;
            *(undefined8 *)((long)(&pvVar18[uVar6].m_centroid + 1) + lVar10) = 0;
            *(undefined8 *)((long)(&pvVar18[uVar6].m_centroid + 1) + lVar10 + 0x20) =
                 0xffffffffffffffff;
            *(undefined4 *)((long)(&pvVar18[uVar6].m_centroid + 1) + lVar10 + 0x28) = 0xffffffff;
            *(undefined1 *)((long)(&pvVar18[uVar6].m_centroid + 1) + lVar10 + 0x2c) = 0;
            lVar10 = lVar10 + 0x70;
          } while ((ulong)(min_new_capacity - uVar6) * 0x70 - lVar10 != 0);
        }
      }
      else {
        pvVar18 = (this->m_nodes).m_p;
        lVar10 = 0;
        do {
          p = *(void **)((long)(&pvVar18[min_new_capacity].m_centroid + 1) + lVar10 + 0x10);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar10 = lVar10 + 0x70;
        } while (lVar10 != 0x6fffffff20);
      }
      (this->m_nodes).m_size = min_new_capacity;
      pvVar18 = (this->m_nodes).m_p;
      pvVar11 = pvVar18 + uVar4;
      if (pvVar11 != (vq_node *)local_b8) {
        lVar10 = 0;
        do {
          (pvVar11->m_centroid).m_s[lVar10] = *(float *)(local_b8 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      pvVar18 = pvVar18 + node_index;
      pvVar11->m_total_weight = uVar15;
      puVar7 = (pvVar11->m_vectors).m_p;
      (pvVar11->m_vectors).m_p = (this->m_left_children).m_p;
      (this->m_left_children).m_p = puVar7;
      uVar5 = (pvVar11->m_vectors).m_size;
      (pvVar11->m_vectors).m_size = (this->m_left_children).m_size;
      (this->m_left_children).m_size = uVar5;
      uVar5 = (pvVar11->m_vectors).m_capacity;
      (pvVar11->m_vectors).m_capacity = (this->m_left_children).m_capacity;
      (this->m_left_children).m_capacity = uVar5;
      pvVar11->m_variance = local_1cc;
      if ((1 < (pvVar11->m_vectors).m_size) && (0.0 < local_1cc)) {
        insert_heap(this,uVar4);
      }
      if (pvVar18 != (vq_node *)local_f8) {
        lVar10 = 0;
        do {
          (pvVar18->m_centroid).m_s[lVar10] = *(float *)(local_f8 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      pvVar18->m_total_weight = uVar14;
      puVar7 = (pvVar18->m_vectors).m_p;
      (pvVar18->m_vectors).m_p = (this->m_right_children).m_p;
      (this->m_right_children).m_p = puVar7;
      uVar5 = (pvVar18->m_vectors).m_size;
      (pvVar18->m_vectors).m_size = (this->m_right_children).m_size;
      (this->m_right_children).m_size = uVar5;
      uVar5 = (pvVar18->m_vectors).m_capacity;
      (pvVar18->m_vectors).m_capacity = (this->m_right_children).m_capacity;
      (this->m_right_children).m_capacity = uVar5;
      pvVar18->m_variance = local_1d0;
      if ((1 < (pvVar18->m_vectors).m_size) && (0.0 < local_1d0)) {
        insert_heap(this,node_index);
      }
    }
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }